

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::
async_read_at_least(connection<websocketpp::config::asio_client::transport_config> *this,
                   size_t num_bytes,char *buf,size_t len,read_handler *handler)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *s_00;
  element_type *peVar1;
  ostream *poVar2;
  size_t __n;
  stringstream s;
  mutable_buffers_1 local_280 [2];
  undefined1 local_260 [32];
  undefined1 local_240 [64];
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>
  local_200;
  undefined1 local_1b8 [16];
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>
  local_1a8 [5];
  
  if ((((this->m_alog).
        super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->m_static_channels & 0x400) != 0) {
    __n = len;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10),"asio async_read_at_least: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    this_00 = (this->m_alog).
              super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__cxx11::stringbuf::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,local_280,__n);
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  s_00 = (this->super_socket_con_type).m_socket.
         super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
  peVar1 = (this->m_strand).
           super___shared_ptr<boost::asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_260._16_8_ = handle_async_read;
  local_260._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_280[0].super_mutable_buffer.data_ = buf;
  local_280[0].super_mutable_buffer.size_ = len;
  get_shared((connection<websocketpp::config::asio_client::transport_config> *)local_260);
  std::
  _Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long)>
  ::
  _Bind<std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long)>
              *)local_240,
             (offset_in_connection<websocketpp::config::asio_client::transport_config>_to_subr *)
             (local_260 + 0x10),
             (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
              *)local_260,handler,(_Placeholder<1> *)&std::placeholders::_1,
             (_Placeholder<2> *)&std::placeholders::_2);
  make_custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long)>>
            (&local_200,(asio *)&this->m_read_handler_allocator,(handler_allocator *)local_240,
             (_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>
              *)handler);
  local_1b8._0_8_ = peVar1->service_;
  local_1b8._8_8_ = peVar1->impl_;
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>
  ::custom_alloc_handler
            ((custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>
              *)(local_1b8 + 0x10),&local_200);
  boost::asio::
  async_read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::asio::detail::transfer_at_least_t,boost::asio::detail::wrapped_handler<boost::asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long)>>,boost::asio::detail::is_continuation_if_running>>
            (s_00,local_280,(transfer_at_least_t)num_bytes,
             (wrapped_handler<boost::asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>,_boost::asio::detail::is_continuation_if_running>
              *)local_1b8,(type *)0x0);
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                  *)(local_1b8 + 0x28));
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::~_Tuple_impl(&local_200.handler_._M_bound_args.
                  super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                );
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                  *)(local_240 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  return;
}

Assistant:

void async_read_at_least(size_t num_bytes, char *buf, size_t len,
        read_handler handler)
    {
        if (m_alog->static_test(log::alevel::devel)) {
            std::stringstream s;
            s << "asio async_read_at_least: " << num_bytes;
            m_alog->write(log::alevel::devel,s.str());
        }

        // TODO: safety vs speed ?
        // maybe move into an if devel block
        /*if (num_bytes > len) {
            m_elog->write(log::elevel::devel,
                "asio async_read_at_least error::invalid_num_bytes");
            handler(make_error_code(transport::error::invalid_num_bytes),
                size_t(0));
            return;
        }*/

        if (config::enable_multithreading) {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                m_strand->wrap(make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );    
        }
        
    }